

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

char * llb_buildsystem_command_get_description(llb_buildsystem_command_t *command_p)

{
  SmallVectorStorage<char,_256U> *pSVar1;
  char *pcVar2;
  SmallString<256U> result;
  SmallString<256U> local_128;
  
  pSVar1 = &local_128.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  local_128.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_128.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  local_128.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = pSVar1;
  (**(code **)(*(long *)command_p + 0x18))(command_p,&local_128);
  pcVar2 = llvm::SmallString<256U>::c_str(&local_128);
  pcVar2 = strdup(pcVar2);
  if ((SmallVectorStorage<char,_256U> *)
      local_128.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX != pSVar1) {
    free(local_128.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  return pcVar2;
}

Assistant:

char* llb_buildsystem_command_get_description(
    llb_buildsystem_command_t* command_p) {
  auto command = (Command*) command_p;

  SmallString<256> result;
  command->getShortDescription(result);
  return strdup(result.c_str());
}